

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain.hpp
# Opt level: O0

demand_t * __thiscall so_5::mchain_props::demand_t::operator=(demand_t *this,demand_t *o)

{
  undefined1 local_30 [8];
  demand_t tmp;
  demand_t *o_local;
  demand_t *this_local;
  
  tmp._16_8_ = o;
  demand_t((demand_t *)local_30,o);
  swap((demand_t *)local_30,this);
  ~demand_t((demand_t *)local_30);
  return this;
}

Assistant:

demand_t &
		operator=( demand_t && o )
			{
				demand_t tmp{ std::move(o) };
				tmp.swap( *this );
				return *this;
			}